

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

void duckdb_re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  undefined4 uVar1;
  int iVar2;
  undefined1 *puVar3;
  ulong in_RCX;
  int in_EDX;
  long in_RSI;
  byte in_DIL;
  int i_1;
  char *p;
  int i;
  int local_34;
  char *local_30;
  int local_24;
  
  if ((in_DIL & 1) == 0) {
    std::__cxx11::string::resize(in_RCX);
    local_30 = (char *)std::__cxx11::string::operator[](in_RCX);
    for (local_34 = 0; local_34 < in_EDX; local_34 = local_34 + 1) {
      iVar2 = runetochar(local_30,(Rune *)(in_RSI + (long)local_34 * 4));
      local_30 = local_30 + iVar2;
    }
    std::__cxx11::string::operator[](in_RCX);
    std::__cxx11::string::resize(in_RCX);
    std::__cxx11::string::shrink_to_fit();
  }
  else {
    std::__cxx11::string::resize(in_RCX);
    for (local_24 = 0; local_24 < in_EDX; local_24 = local_24 + 1) {
      uVar1 = *(undefined4 *)(in_RSI + (long)local_24 * 4);
      puVar3 = (undefined1 *)std::__cxx11::string::operator[](in_RCX);
      *puVar3 = (char)uVar1;
    }
  }
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}